

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O3

CURLcode Curl_ossl_verifyhost(Curl_easy *data,connectdata *conn,X509 *server_cert)

{
  proxy_info *ppVar1;
  undefined8 uVar2;
  Curl_easy *data_00;
  _Bool _Var3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  uint uVar8;
  char **ppcVar9;
  GENERAL_NAMES *a;
  int *piVar10;
  char *pcVar11;
  size_t sVar12;
  undefined8 extraout_RAX;
  X509_NAME *name;
  X509_NAME_ENTRY *ne;
  ASN1_STRING *x;
  uchar *__s;
  void *__src;
  size_t sVar13;
  long lVar14;
  undefined7 uVar15;
  CURLcode CVar16;
  int iVar17;
  size_t matchlen;
  bool bVar18;
  uchar *peer_CN;
  in6_addr addr;
  uchar *local_88;
  uint local_7c;
  undefined4 local_78;
  undefined4 local_74;
  undefined8 local_70;
  Curl_easy *local_68;
  size_t local_60;
  char *local_58;
  X509 *local_50;
  ulong local_48;
  undefined1 local_40 [16];
  
  if ((conn->http_proxy).proxytype == '\x02') {
    bVar18 = conn->proxy_ssl[conn->sock[1] != -1].state == ssl_connection_complete;
    ppVar1 = &conn->http_proxy;
    if (bVar18) {
      ppVar1 = (proxy_info *)&conn->host;
    }
    ppcVar9 = &(ppVar1->host).name;
    lVar14 = 0x130;
    if (bVar18) {
      lVar14 = 0xa0;
    }
  }
  else {
    ppcVar9 = &(conn->host).name;
    lVar14 = 0xa0;
  }
  pcVar11 = *ppcVar9;
  local_70 = *(undefined8 *)((conn->chunk).hexbuffer + lVar14 + -0x3d);
  local_50 = (X509 *)server_cert;
  local_60 = strlen(pcVar11);
  local_58 = pcVar11;
  if ((((conn->bits).field_0x5 & 8) == 0) || (iVar4 = inet_pton(10,pcVar11,local_40), iVar4 == 0)) {
    iVar4 = inet_pton(2,pcVar11,local_40);
    local_48 = (ulong)((uint)(iVar4 != 0) * 4);
    iVar4 = (uint)(iVar4 != 0) * 5 + 2;
  }
  else {
    iVar4 = 7;
    local_48 = 0x10;
  }
  sVar13 = 0;
  a = (GENERAL_NAMES *)X509_get_ext_d2i(local_50,0x55,(int *)0x0,(int *)0x0);
  if (a != (GENERAL_NAMES *)0x0) {
    iVar5 = OPENSSL_sk_num(a);
    if (iVar5 < 1) {
      GENERAL_NAMES_free(a);
    }
    else {
      local_74 = 0;
      local_78 = 0;
      local_7c = 0;
      iVar17 = 0;
      local_68 = data;
      do {
        piVar10 = (int *)OPENSSL_sk_value(a,iVar17);
        iVar6 = *piVar10;
        uVar15 = (undefined7)(sVar13 >> 8);
        if (iVar6 == 2) {
          sVar13 = CONCAT71(uVar15,1);
          local_74 = (undefined4)sVar13;
        }
        else if (iVar6 == 7) {
          sVar13 = CONCAT71(uVar15,1);
          local_78 = (undefined4)sVar13;
        }
        if (iVar6 == iVar4) {
          pcVar11 = (char *)ASN1_STRING_get0_data(*(undefined8 *)(piVar10 + 2));
          iVar6 = ASN1_STRING_length(*(ASN1_STRING **)(piVar10 + 2));
          matchlen = (size_t)iVar6;
          if (iVar4 == 7) {
            if ((local_48 == matchlen) && (iVar6 = bcmp(pcVar11,local_40,local_48), iVar6 == 0)) {
              Curl_infof(local_68," subjectAltName: host \"%s\" matched cert\'s IP address!",
                         local_70);
              local_7c = (uint)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
            }
          }
          else if (((iVar4 == 2) && (sVar12 = strlen(pcVar11), sVar12 == matchlen)) &&
                  (sVar13 = local_60,
                  _Var3 = Curl_cert_hostcheck(pcVar11,matchlen,local_58,local_60), _Var3)) {
            Curl_infof(local_68," subjectAltName: host \"%s\" matched cert\'s \"%s\"",local_70,
                       pcVar11);
            GENERAL_NAMES_free(a);
            return CURLE_OK;
          }
        }
        iVar17 = iVar17 + 1;
      } while (iVar17 < iVar5);
      GENERAL_NAMES_free(a);
      data_00 = local_68;
      uVar2 = local_70;
      if ((local_7c & 1) != 0) {
        return CURLE_OK;
      }
      data = local_68;
      if ((((byte)local_74 | (byte)local_78) & 1) != 0) {
        Curl_infof(local_68," subjectAltName does not match %s",local_70);
        Curl_failf(data_00,
                   "SSL: no alternative certificate subject name matches target host name \'%s\'",
                   uVar2);
        return CURLE_PEER_FAILED_VERIFICATION;
      }
    }
  }
  local_88 = (uchar *)0x0;
  name = X509_get_subject_name(local_50);
  if (name == (X509_NAME *)0x0) {
LAB_005cd1d2:
    pcVar11 = "SSL: unable to obtain common name from peer certificate";
LAB_005cd1d9:
    Curl_failf(data,pcVar11);
  }
  else {
    iVar4 = -1;
    do {
      iVar5 = iVar4;
      iVar4 = X509_NAME_get_index_by_NID(name,0xd,iVar5);
    } while (-1 < iVar4);
    if (iVar5 < 0) goto LAB_005cd1d2;
    ne = X509_NAME_get_entry(name,iVar5);
    x = X509_NAME_ENTRY_get_data(ne);
    if (x == (ASN1_STRING *)0x0) goto LAB_005cd1d2;
    iVar4 = ASN1_STRING_type(x);
    if (iVar4 != 0xc) {
      uVar7 = ASN1_STRING_to_UTF8(&local_88,x);
      __s = local_88;
      if (local_88 != (uchar *)0x0) goto LAB_005cd182;
      goto LAB_005cd1d2;
    }
    uVar7 = ASN1_STRING_length(x);
    if ((int)uVar7 < 0) goto LAB_005cd1d2;
    __s = (uchar *)CRYPTO_malloc(uVar7 + 1,
                                 "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmcurl/lib/vtls/openssl.c"
                                 ,0x867);
    if (__s == (uchar *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    local_88 = __s;
    __src = (void *)ASN1_STRING_get0_data(x);
    memcpy(__s,__src,(ulong)uVar7);
    __s[uVar7] = '\0';
LAB_005cd182:
    sVar13 = strlen((char *)__s);
    uVar8 = curlx_uztosi(sVar13);
    if (uVar8 != uVar7) {
      pcVar11 = "SSL: illegal cert name field";
      goto LAB_005cd1d9;
    }
    if (local_88 == (uchar *)0x0) goto LAB_005cd1d2;
    _Var3 = Curl_cert_hostcheck((char *)local_88,(long)(int)uVar7,local_58,local_60);
    if (_Var3) {
      CVar16 = CURLE_OK;
      Curl_infof(data," common name: %s (matched)");
      goto LAB_005cd1e8;
    }
    Curl_failf(data,"SSL: certificate subject name \'%s\' does not match target host name \'%s\'",
               local_88,local_70);
  }
  CVar16 = CURLE_PEER_FAILED_VERIFICATION;
LAB_005cd1e8:
  if (local_88 != (uchar *)0x0) {
    CRYPTO_free(local_88);
  }
  return CVar16;
}

Assistant:

CURLcode Curl_ossl_verifyhost(struct Curl_easy *data, struct connectdata *conn,
                              X509 *server_cert)
{
  bool matched = FALSE;
  int target = GEN_DNS; /* target type, GEN_DNS or GEN_IPADD */
  size_t addrlen = 0;
  STACK_OF(GENERAL_NAME) *altnames;
#ifdef ENABLE_IPV6
  struct in6_addr addr;
#else
  struct in_addr addr;
#endif
  CURLcode result = CURLE_OK;
  bool dNSName = FALSE; /* if a dNSName field exists in the cert */
  bool iPAddress = FALSE; /* if a iPAddress field exists in the cert */
  const char * const hostname = SSL_HOST_NAME();
  const char * const dispname = SSL_HOST_DISPNAME();
  size_t hostlen = strlen(hostname);

#ifdef ENABLE_IPV6
  if(conn->bits.ipv6_ip &&
     Curl_inet_pton(AF_INET6, hostname, &addr)) {
    target = GEN_IPADD;
    addrlen = sizeof(struct in6_addr);
  }
  else
#endif
    if(Curl_inet_pton(AF_INET, hostname, &addr)) {
      target = GEN_IPADD;
      addrlen = sizeof(struct in_addr);
    }

  /* get a "list" of alternative names */
  altnames = X509_get_ext_d2i(server_cert, NID_subject_alt_name, NULL, NULL);

  if(altnames) {
#ifdef OPENSSL_IS_BORINGSSL
    size_t numalts;
    size_t i;
#else
    int numalts;
    int i;
#endif
    bool dnsmatched = FALSE;
    bool ipmatched = FALSE;

    /* get amount of alternatives, RFC2459 claims there MUST be at least
       one, but we don't depend on it... */
    numalts = sk_GENERAL_NAME_num(altnames);

    /* loop through all alternatives - until a dnsmatch */
    for(i = 0; (i < numalts) && !dnsmatched; i++) {
      /* get a handle to alternative name number i */
      const GENERAL_NAME *check = sk_GENERAL_NAME_value(altnames, i);

      if(check->type == GEN_DNS)
        dNSName = TRUE;
      else if(check->type == GEN_IPADD)
        iPAddress = TRUE;

      /* only check alternatives of the same type the target is */
      if(check->type == target) {
        /* get data and length */
        const char *altptr = (char *)ASN1_STRING_get0_data(check->d.ia5);
        size_t altlen = (size_t) ASN1_STRING_length(check->d.ia5);

        switch(target) {
        case GEN_DNS: /* name/pattern comparison */
          /* The OpenSSL man page explicitly says: "In general it cannot be
             assumed that the data returned by ASN1_STRING_data() is null
             terminated or does not contain embedded nulls." But also that
             "The actual format of the data will depend on the actual string
             type itself: for example for an IA5String the data will be ASCII"

             It has been however verified that in 0.9.6 and 0.9.7, IA5String
             is always null-terminated.
          */
          if((altlen == strlen(altptr)) &&
             /* if this isn't true, there was an embedded zero in the name
                string and we cannot match it. */
             subj_alt_hostcheck(data,
                                altptr,
                                altlen, hostname, hostlen, dispname)) {
            dnsmatched = TRUE;
          }
          break;

        case GEN_IPADD: /* IP address comparison */
          /* compare alternative IP address if the data chunk is the same size
             our server IP address is */
          if((altlen == addrlen) && !memcmp(altptr, &addr, altlen)) {
            ipmatched = TRUE;
            infof(data,
                  " subjectAltName: host \"%s\" matched cert's IP address!",
                  dispname);
          }
          break;
        }
      }
    }
    GENERAL_NAMES_free(altnames);

    if(dnsmatched || ipmatched)
      matched = TRUE;
  }

  if(matched)
    /* an alternative name matched */
    ;
  else if(dNSName || iPAddress) {
    infof(data, " subjectAltName does not match %s", dispname);
    failf(data, "SSL: no alternative certificate subject name matches "
          "target host name '%s'", dispname);
    result = CURLE_PEER_FAILED_VERIFICATION;
  }
  else {
    /* we have to look to the last occurrence of a commonName in the
       distinguished one to get the most significant one. */
    int i = -1;
    unsigned char *peer_CN = NULL;
    int peerlen = 0;

    /* The following is done because of a bug in 0.9.6b */
    X509_NAME *name = X509_get_subject_name(server_cert);
    if(name) {
      int j;
      while((j = X509_NAME_get_index_by_NID(name, NID_commonName, i)) >= 0)
        i = j;
    }

    /* we have the name entry and we will now convert this to a string
       that we can use for comparison. Doing this we support BMPstring,
       UTF8, etc. */

    if(i >= 0) {
      ASN1_STRING *tmp =
        X509_NAME_ENTRY_get_data(X509_NAME_get_entry(name, i));

      /* In OpenSSL 0.9.7d and earlier, ASN1_STRING_to_UTF8 fails if the input
         is already UTF-8 encoded. We check for this case and copy the raw
         string manually to avoid the problem. This code can be made
         conditional in the future when OpenSSL has been fixed. */
      if(tmp) {
        if(ASN1_STRING_type(tmp) == V_ASN1_UTF8STRING) {
          peerlen = ASN1_STRING_length(tmp);
          if(peerlen >= 0) {
            peer_CN = OPENSSL_malloc(peerlen + 1);
            if(peer_CN) {
              memcpy(peer_CN, ASN1_STRING_get0_data(tmp), peerlen);
              peer_CN[peerlen] = '\0';
            }
            else
              result = CURLE_OUT_OF_MEMORY;
          }
        }
        else /* not a UTF8 name */
          peerlen = ASN1_STRING_to_UTF8(&peer_CN, tmp);

        if(peer_CN && (curlx_uztosi(strlen((char *)peer_CN)) != peerlen)) {
          /* there was a terminating zero before the end of string, this
             cannot match and we return failure! */
          failf(data, "SSL: illegal cert name field");
          result = CURLE_PEER_FAILED_VERIFICATION;
        }
      }
    }

    if(result)
      /* error already detected, pass through */
      ;
    else if(!peer_CN) {
      failf(data,
            "SSL: unable to obtain common name from peer certificate");
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else if(!Curl_cert_hostcheck((const char *)peer_CN,
                                 peerlen, hostname, hostlen)) {
      failf(data, "SSL: certificate subject name '%s' does not match "
            "target host name '%s'", peer_CN, dispname);
      result = CURLE_PEER_FAILED_VERIFICATION;
    }
    else {
      infof(data, " common name: %s (matched)", peer_CN);
    }
    if(peer_CN)
      OPENSSL_free(peer_CN);
  }

  return result;
}